

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadsheetMode.cpp
# Opt level: O1

void __thiscall KDReports::Test::initTestCase(Test *this)

{
  QDebug QVar1;
  int iVar2;
  longlong __tmp;
  char16_t *pcVar3;
  QChar *pQVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QFontInfo info;
  QFont font;
  QDebug local_b0;
  QArrayDataPointer<char16_t> local_a8;
  QFontInfo local_88 [8];
  QByteArrayView local_80;
  QDebug local_70;
  char *local_68;
  QFont local_60 [16];
  QArrayDataPointer<char16_t> local_50;
  char *local_38;
  
  QCoreApplication::setAttribute(AA_Use96Dpi,true);
  local_68 = "Noto Sans";
  QByteArrayView::QByteArrayView<const_char_*,_true>(&local_80,&local_68);
  QVar5.m_data = (storage_type *)local_80.m_size;
  QVar5.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar5);
  local_a8.d = local_50.d;
  local_a8.ptr = local_50.ptr;
  local_50.d = (Data *)0x0;
  local_50.ptr = (char16_t *)0x0;
  local_a8.size = local_50.size;
  local_50.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  QFont::QFont(local_60,(QString *)&local_a8,0x30,-1,false);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  QFontInfo::QFontInfo(local_88,local_60);
  QFontInfo::family();
  pQVar4 = (QChar *)local_50.ptr;
  if ((QChar *)local_50.ptr == (QChar *)0x0) {
    pQVar4 = (QChar *)&QString::_empty;
  }
  iVar2 = QString::compare_helper(pQVar4,local_50.size,"Noto Sans",-1,CaseSensitive);
  fontFound = iVar2 == 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  local_50.d = (Data *)0x3000000002;
  local_50.ptr = 
  L"/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
  ;
  local_50.size = 0x10c7f7;
  local_38 = "default";
  QMessageLogger::debug();
  QVar1.stream = local_b0.stream;
  local_68 = "Setting DPI to 96. ";
  QByteArrayView::QByteArrayView<const_char_*,_true>(&local_80,&local_68);
  QVar6.m_data = (storage_type *)local_80.m_size;
  QVar6.m_size = (qsizetype)&local_a8;
  QString::fromUtf8(QVar6);
  QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  if (*(QTextStream *)(local_b0.stream + 0x30) == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)local_b0.stream,' ');
  }
  QVar1.stream = local_b0.stream;
  local_68 = "Noto Sans";
  QByteArrayView::QByteArrayView<const_char_*,_true>(&local_80,&local_68);
  QVar7.m_data = (storage_type *)local_80.m_size;
  QVar7.m_size = (qsizetype)&local_a8;
  QString::fromUtf8(QVar7);
  QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  if (*(QTextStream *)(local_b0.stream + 0x30) == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)local_b0.stream,' ');
  }
  QVar1.stream = local_b0.stream;
  local_68 = "48 has a size of";
  QByteArrayView::QByteArrayView<const_char_*,_true>(&local_80,&local_68);
  QVar8.m_data = (storage_type *)local_80.m_size;
  QVar8.m_size = (qsizetype)&local_a8;
  QString::fromUtf8(QVar8);
  QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  if (*(QTextStream *)(local_b0.stream + 0x30) == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)local_b0.stream,' ');
  }
  QFontMetrics::QFontMetrics((QFontMetrics *)&local_a8,local_60);
  iVar2 = QFontMetrics::height();
  QTextStream::operator<<((QTextStream *)local_b0.stream,iVar2);
  if (*(QTextStream *)(local_b0.stream + 0x30) == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)local_b0.stream,' ');
  }
  QFontMetrics::~QFontMetrics((QFontMetrics *)&local_a8);
  QDebug::~QDebug(&local_b0);
  local_50.d = (Data *)0x3100000002;
  local_50.ptr = 
  L"/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
  ;
  local_50.size = 0x10c7f7;
  local_38 = "default";
  QMessageLogger::debug();
  operator<<((Stream *)&local_80,(QFont *)&local_70);
  QFontInfo::family();
  pcVar3 = local_a8.ptr;
  if (local_a8.ptr == (char16_t *)0x0) {
    pcVar3 = (char16_t *)&QString::_empty;
  }
  QDebug::putString((QChar *)&local_80,(ulong)pcVar3);
  if (*(QTextStream *)(local_80.m_size + 0x30) == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)local_80.m_size,' ');
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  QDebug::~QDebug((QDebug *)&local_80);
  QDebug::~QDebug(&local_70);
  QFontInfo::~QFontInfo(local_88);
  QFont::~QFont(local_60);
  return;
}

Assistant:

void initTestCase()
    {
        // Force the DPI do the same value as on Windows
        // (mostly for testFontScaling)
        qApp->setAttribute(Qt::AA_Use96Dpi, true);
        QFont font(s_fontName, 48);
        QFontInfo info(font);
        fontFound = (info.family() == s_fontName);
        qDebug() << "Setting DPI to 96. " << s_fontName << "48 has a size of" << QFontMetrics(font).height();
        qDebug() << font << info.family();
        // Unfortunately, Qt on Mac OSX hardcodes 72 DPI, so we'll always have different results there.
    }